

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

reference __thiscall
immutable::vector_iterator<int,_true,_5>::operator*(vector_iterator<int,_true,_5> *this)

{
  uint uVar1;
  uint index;
  uint local_20;
  uint local_1c;
  int *local_18;
  
  index = this->_index;
  uVar1 = (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
          super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
  if ((index < uVar1) ||
     ((this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
      super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl <= index)) {
    rrb_region_for<int,true,5>((immutable *)&local_20,&this->_impl,index);
    (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
    super__Head_base<0UL,_const_int_*,_false>._M_head_impl = local_18;
    (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
    _M_head_impl = local_1c;
    (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl = local_20;
    index = this->_index;
  }
  else {
    local_18 = (this->_cursor).super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
               super__Head_base<0UL,_const_int_*,_false>._M_head_impl;
    local_1c = uVar1;
  }
  return local_18 + (index - local_1c);
}

Assistant:

reference operator* () const
        {
        if (_index < std::get<1>(_cursor) || _index >= std::get<2>(_cursor))
          {
          _cursor = rrb_region_for(_impl, _index);
          }
        return std::get<0>(_cursor)[_index - std::get<1>(_cursor)];
        }